

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsClient.cpp
# Opt level: O0

string * __thiscall xs::parseString_abi_cxx11_(string *__return_storage_ptr__,xs *this,char *str)

{
  xs xVar1;
  xs xVar2;
  bool bVar3;
  allocator<char> local_1ad [13];
  ostringstream local_1a0 [8];
  ostringstream o;
  xs *pxStack_20;
  char endChar;
  char *p;
  char *str_local;
  
  if ((*this == (xs)0x27) || (*this == (xs)0x22)) {
    xVar1 = *this;
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    pxStack_20 = this + 1;
    while( true ) {
      bVar3 = false;
      if (*pxStack_20 != xVar1) {
        bVar3 = *pxStack_20 != (xs)0x0;
      }
      if (!bVar3) break;
      if (*pxStack_20 == (xs)0x5c) {
        xVar2 = pxStack_20[1];
        if (xVar2 != (xs)0x0) {
          if (xVar2 == (xs)0x6e) {
            std::operator<<((ostream *)local_1a0,'\n');
          }
          else if (xVar2 == (xs)0x74) {
            std::operator<<((ostream *)local_1a0,'\t');
          }
          else {
            std::operator<<((ostream *)local_1a0,(char)pxStack_20[1]);
          }
        }
        pxStack_20 = pxStack_20 + 2;
      }
      else {
        std::operator<<((ostream *)local_1a0,(char)*pxStack_20);
        pxStack_20 = pxStack_20 + 1;
      }
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)this,local_1ad);
    std::allocator<char>::~allocator(local_1ad);
  }
  return __return_storage_ptr__;
}

Assistant:

string parseString (const char* str)
{
	if (str[0] == '\'' || str[0] == '"')
	{
		const char*			p		= str;
		char				endChar = *p++;
		std::ostringstream	o;

		while (*p != endChar && *p)
		{
			if (*p == '\\')
			{
				switch (p[1])
				{
					case 0:		DE_ASSERT(DE_FALSE);	break;
					case 'n':	o << '\n';				break;
					case 't':	o << '\t';				break;
					default:	o << p[1];				break;
				}

				p += 2;
			}
			else
				o << *p++;
		}

		return o.str();
	}
	else
		return string(str);
}